

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiTabItem * ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImGuiTabItem *pIVar2;
  long lVar3;
  ulong uVar4;
  ImGuiTabItem *pIVar5;
  ulong uVar6;
  
  uVar1 = (tab_bar->Tabs).Size;
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  pIVar5 = (ImGuiTabItem *)0x0;
  for (; uVar4 * 0x28 - uVar6 != 0; uVar6 = uVar6 + 0x28) {
    pIVar2 = (tab_bar->Tabs).Data;
    if ((((pIVar5 == (ImGuiTabItem *)0x0) ||
         (pIVar5->LastFrameSelected < *(int *)((long)&pIVar2->LastFrameSelected + uVar6))) &&
        (lVar3 = *(long *)((long)&pIVar2->Window + uVar6), lVar3 != 0)) &&
       (*(char *)(lVar3 + 0xb0) != '\0')) {
      pIVar5 = (ImGuiTabItem *)((long)&pIVar2->ID + uVar6);
    }
  }
  return pIVar5;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindMostRecentlySelectedTabForActiveWindow(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* most_recently_selected_tab = NULL;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            if (tab->Window && tab->Window->WasActive)
                most_recently_selected_tab = tab;
    }
    return most_recently_selected_tab;
}